

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall p2t::Sweep::FillAdvancingFront(Sweep *this,SweepContext *tcx,Node *n)

{
  Node *pNVar1;
  Node *pNVar2;
  Point *pPVar3;
  bool bVar4;
  double dVar5;
  
  pNVar1 = n->next;
  pNVar2 = pNVar1->next;
  while (pNVar2 != (Node *)0x0) {
    bVar4 = LargeHole_DontFill(this,pNVar1);
    if (bVar4) break;
    Fill(this,tcx,pNVar1);
    pNVar1 = pNVar1->next;
    pNVar2 = pNVar1->next;
  }
  pNVar1 = n->prev;
  pNVar2 = pNVar1->prev;
  while (pNVar2 != (Node *)0x0) {
    bVar4 = LargeHole_DontFill(this,pNVar1);
    if (bVar4) break;
    Fill(this,tcx,pNVar1);
    pNVar1 = pNVar1->prev;
    pNVar2 = pNVar1->prev;
  }
  if (((n->next != (Node *)0x0) && (pNVar1 = n->next->next, pNVar1 != (Node *)0x0)) &&
     (pPVar3 = pNVar1->point, dVar5 = atan2(n->point->y - pPVar3->y,n->point->x - pPVar3->x),
     dVar5 < 2.356194490192345)) {
    FillBasin(this,tcx,n);
    return;
  }
  return;
}

Assistant:

void Sweep::FillAdvancingFront(SweepContext& tcx, Node& n)
{

  // Fill right holes
  Node* node = n.next;

  while (node->next) {
    // if HoleAngle exceeds 90 degrees then break.
    if (LargeHole_DontFill(node)) break;
    Fill(tcx, *node);
    node = node->next;
  }

  // Fill left holes
  node = n.prev;

  while (node->prev) {
    // if HoleAngle exceeds 90 degrees then break.
    if (LargeHole_DontFill(node)) break;
    Fill(tcx, *node);
    node = node->prev;
  }

  // Fill right basins
  if (n.next && n.next->next) {
    const double angle = BasinAngle(n);
    if (angle < PI_3div4) {
      FillBasin(tcx, n);
    }
  }
}